

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::RenderDimmedBackgroundBehindWindow(ImGuiWindow *window,ImU32 col)

{
  ImDrawCmd *pIVar1;
  int iVar2;
  ImDrawList *this;
  ImDrawCmd *pIVar3;
  ImRect IVar4;
  ImRect viewport_rect;
  ImDrawCmd cmd;
  ImVec2 local_70;
  ImRect local_68;
  ImDrawCmd local_58;
  
  if (0xffffff < col) {
    IVar4 = ImGuiViewportP::GetMainRect(*(GImGui->Viewports).Data);
    this = window->RootWindow->DrawList;
    local_68 = IVar4;
    if ((this->CmdBuffer).Size == 0) {
      ImDrawList::AddDrawCmd(this);
    }
    local_58.ClipRect.y = IVar4.Min.y + -1.0;
    local_58.ClipRect.x = IVar4.Min.x + -1.0;
    local_70.y = IVar4.Max.y + 1.0;
    local_70.x = IVar4.Max.x + 1.0;
    ImDrawList::PushClipRect(this,(ImVec2 *)&local_58,&local_70,false);
    ImDrawList::AddRectFilled(this,&local_68.Min,&local_68.Max,col,0.0,0);
    pIVar3 = (this->CmdBuffer).Data;
    iVar2 = (this->CmdBuffer).Size;
    local_58.UserCallbackData = pIVar3[(long)iVar2 + -1].UserCallbackData;
    pIVar1 = pIVar3 + (long)iVar2 + -1;
    local_58.ClipRect.x = (pIVar1->ClipRect).x;
    local_58.ClipRect.y = (pIVar1->ClipRect).y;
    local_58.ClipRect.z = (pIVar1->ClipRect).z;
    local_58.ClipRect.w = (pIVar1->ClipRect).w;
    local_58.TextureId = pIVar3[(long)iVar2 + -1].TextureId;
    local_58._24_8_ = (&pIVar3[(long)iVar2 + -1].TextureId)[1];
    pIVar3 = pIVar3 + (long)iVar2 + -1;
    local_58.ElemCount = pIVar3->ElemCount;
    local_58._36_4_ = *(undefined4 *)&pIVar3->field_0x24;
    local_58.UserCallback = *(ImDrawCallback *)(&pIVar3->ElemCount + 2);
    (this->CmdBuffer).Size = iVar2 + -1;
    ImVector<ImDrawCmd>::push_front(&this->CmdBuffer,&local_58);
    ImDrawList::PopClipRect(this);
    ImDrawList::AddDrawCmd(this);
  }
  return;
}

Assistant:

static void ImGui::RenderDimmedBackgroundBehindWindow(ImGuiWindow* window, ImU32 col)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    ImGuiViewportP* viewport = (ImGuiViewportP*)GetMainViewport();
    ImRect viewport_rect = viewport->GetMainRect();

    // Draw behind window by moving the draw command at the FRONT of the draw list
    {
        // We've already called AddWindowToDrawData() which called DrawList->ChannelsMerge() on DockNodeHost windows,
        // and draw list have been trimmed already, hence the explicit recreation of a draw command if missing.
        // FIXME: This is creating complication, might be simpler if we could inject a drawlist in drawdata at a given position and not attempt to manipulate ImDrawCmd order.
        ImDrawList* draw_list = window->RootWindow->DrawList;
        if (draw_list->CmdBuffer.Size == 0)
            draw_list->AddDrawCmd();
        draw_list->PushClipRect(viewport_rect.Min - ImVec2(1, 1), viewport_rect.Max + ImVec2(1, 1), false); // Ensure ImDrawCmd are not merged
        draw_list->AddRectFilled(viewport_rect.Min, viewport_rect.Max, col);
        ImDrawCmd cmd = draw_list->CmdBuffer.back();
        IM_ASSERT(cmd.ElemCount == 6);
        draw_list->CmdBuffer.pop_back();
        draw_list->CmdBuffer.push_front(cmd);
        draw_list->PopClipRect();
        draw_list->AddDrawCmd(); // We need to create a command as CmdBuffer.back().IdxOffset won't be correct if we append to same command.
    }
}